

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildFloat32x4_2Int4
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot,
          RegSlot src5RegSlot)

{
  RegOpnd *this_00;
  RegOpnd *pRVar1;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *src1_01;
  RegOpnd *src1_02;
  Instr *pIVar2;
  Opnd *pOVar3;
  OpCode opcode;
  Instr *instr;
  RegOpnd *src5Opnd;
  RegOpnd *src4Opnd;
  RegOpnd *src3Opnd;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = BuildDstOpnd(this,dstRegSlot,TySimd128F4);
  pRVar1 = BuildSrcOpnd(this,src1RegSlot,TySimd128F4);
  src1 = BuildIntConstOpnd(this,src2RegSlot);
  src1_00 = BuildIntConstOpnd(this,src3RegSlot);
  src1_01 = BuildIntConstOpnd(this,src4RegSlot);
  src1_02 = BuildIntConstOpnd(this,src5RegSlot);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Simd);
  IR::Opnd::SetValueType(&pRVar1->super_Opnd,ValueType::Simd);
  pIVar2 = AddExtendedArg(this,pRVar1,(RegOpnd *)0x0,offset);
  pOVar3 = IR::Instr::GetDst(pIVar2);
  pRVar1 = IR::Opnd::AsRegOpnd(pOVar3);
  pIVar2 = AddExtendedArg(this,src1,pRVar1,offset);
  pOVar3 = IR::Instr::GetDst(pIVar2);
  pRVar1 = IR::Opnd::AsRegOpnd(pOVar3);
  pIVar2 = AddExtendedArg(this,src1_00,pRVar1,offset);
  pOVar3 = IR::Instr::GetDst(pIVar2);
  pRVar1 = IR::Opnd::AsRegOpnd(pOVar3);
  pIVar2 = AddExtendedArg(this,src1_01,pRVar1,offset);
  pOVar3 = IR::Instr::GetDst(pIVar2);
  pRVar1 = IR::Opnd::AsRegOpnd(pOVar3);
  pIVar2 = AddExtendedArg(this,src1_02,pRVar1,offset);
  pOVar3 = IR::Instr::GetDst(pIVar2);
  pIVar2 = IR::Instr::New(Simd128_Swizzle_F4,&this_00->super_Opnd,pOVar3,this->m_func);
  AddInstr(this,pIVar2,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildFloat32x4_2Int4(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG6)
{
    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128F4);
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128F4);

    IR::RegOpnd * src2Opnd = BuildIntConstOpnd(src2RegSlot);
    IR::RegOpnd * src3Opnd = BuildIntConstOpnd(src3RegSlot);
    IR::RegOpnd * src4Opnd = BuildIntConstOpnd(src4RegSlot);
    IR::RegOpnd * src5Opnd = BuildIntConstOpnd(src5RegSlot);

    IR::Instr * instr = nullptr;
    dstOpnd->SetValueType(ValueType::Simd);
    src1Opnd->SetValueType(ValueType::Simd);

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src3Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src4Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src5Opnd, instr->GetDst()->AsRegOpnd(), offset);

    Js::OpCode opcode = Js::OpCode::Simd128_Swizzle_F4;

    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}